

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PollerSelect.cpp
# Opt level: O0

void __thiscall Liby::PollerSelect::addChanel(PollerSelect *this,Channel *ch)

{
  int iVar1;
  undefined8 *puVar2;
  bool bVar3;
  int fd;
  Channel *ch_local;
  PollerSelect *this_local;
  
  bVar3 = false;
  if (ch != (Channel *)0x0) {
    iVar1 = Channel::get_fd(ch);
    bVar3 = -1 < iVar1;
  }
  if (bVar3) {
    iVar1 = Channel::get_fd(ch);
    if (iVar1 < 0x400) {
      if (this->maxfd_ <= iVar1) {
        this->maxfd_ = iVar1 + 1;
      }
      Poller::setChannel(&this->super_Poller,iVar1,ch);
      bVar3 = Channel::readable(ch);
      if (bVar3) {
        (this->rset_).fds_bits[iVar1 / 0x40] =
             1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | (this->rset_).fds_bits[iVar1 / 0x40];
      }
      bVar3 = Channel::writable(ch);
      if (bVar3) {
        (this->wset_).fds_bits[iVar1 / 0x40] =
             1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | (this->wset_).fds_bits[iVar1 / 0x40];
      }
      (this->eset_).fds_bits[iVar1 / 0x40] =
           1L << ((byte)((long)iVar1 % 0x40) & 0x3f) | (this->eset_).fds_bits[iVar1 / 0x40];
      return;
    }
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = "fd >= 1024";
    __cxa_throw(puVar2,&char_const*::typeinfo,0);
  }
  __assert_fail("ch && ch->get_fd() >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/PollerSelect.cpp"
                ,9,"virtual void Liby::PollerSelect::addChanel(Channel *)");
}

Assistant:

void PollerSelect::addChanel(Channel *ch) {
    assert(ch && ch->get_fd() >= 0);

    int fd = ch->get_fd();
    if (fd >= FD_SETSIZE) {
        throw "fd >= 1024";
    }

    if (fd >= maxfd_) {
        maxfd_ = fd + 1;
    }

    setChannel(fd, ch);

    if (ch->readable())
        FD_SET(fd, &rset_);
    if (ch->writable())
        FD_SET(fd, &wset_);
    FD_SET(fd, &eset_);
}